

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  uint __fd;
  int iVar1;
  int *piVar2;
  char *__s;
  ulong uVar3;
  
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar3 = 0;
    do {
      __fd = pipes[uVar3][1];
      if ((int)__fd < 0) {
        if (uVar3 < 3) {
          __fd = open("/dev/null",(uint)(uVar3 != 0) * 2);
          if (__fd != 0xffffffff) goto LAB_0010dd29;
          piVar2 = __errno_location();
          uv__write_int(error_fd,-*piVar2);
          __s = "failed to open stdio";
          goto LAB_0010de43;
        }
      }
      else {
        if (pipes[uVar3][0] != -1) {
          uv__close(pipes[uVar3][0]);
        }
LAB_0010dd29:
        if (uVar3 == __fd) {
          uv__cloexec(__fd,0);
        }
        else {
          dup2(__fd,(int)uVar3);
          uv__close(__fd);
        }
        if (uVar3 < 3) {
          uv__nonblock((int)uVar3,0);
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)stdio_count != uVar3);
  }
  if (options->cwd != (char *)0x0) {
    iVar1 = chdir(options->cwd);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      uv__write_int(error_fd,-*piVar2);
      __s = "chdir()";
      goto LAB_0010de43;
    }
  }
  if ((options->flags & 2) != 0) {
    iVar1 = setgid(options->gid);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      uv__write_int(error_fd,-*piVar2);
      __s = "setgid()";
      goto LAB_0010de43;
    }
  }
  if ((options->flags & 1) != 0) {
    iVar1 = setuid(options->uid);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      uv__write_int(error_fd,-*piVar2);
      __s = "setuid()";
      goto LAB_0010de43;
    }
  }
  if (options->env != (char **)0x0) {
    _environ = options->env;
  }
  execvp(options->file,options->args);
  piVar2 = __errno_location();
  uv__write_int(error_fd,-*piVar2);
  __s = "execvp()";
LAB_0010de43:
  perror(__s);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  int close_fd;
  int use_fd;
  int fd;

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd >= 0) {
      if (close_fd != -1)
        uv__close(close_fd);
    }
    else if (fd >= 3)
      continue;
    else {
      /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
       * set
       */
      use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);

      if (use_fd == -1) {
        uv__write_int(error_fd, -errno);
        perror("failed to open stdio");
        _exit(127);
      }
    }

    if (fd == use_fd)
      uv__cloexec(use_fd, 0);
    else {
      dup2(use_fd, fd);
      uv__close(use_fd);
    }

    if (fd <= 2)
      uv__nonblock(fd, 0);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, -errno);
    perror("chdir()");
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, -errno);
    perror("setgid()");
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, -errno);
    perror("setuid()");
    _exit(127);
  }

  if (options->env != NULL) {
    environ = options->env;
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, -errno);
  perror("execvp()");
  _exit(127);
}